

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestSuite::~TestSuite(TestSuite *this)

{
  TestSuite *this_local;
  
  this->_vptr_TestSuite = (_func_int **)&PTR__TestSuite_001d1e18;
  internal::
  ForEach<std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>,void(*)(testing::TestInfo*)>
            (&this->test_info_list_,internal::Delete<testing::TestInfo>);
  TestResult::~TestResult(&this->ad_hoc_test_result_);
  std::vector<int,_std::allocator<int>_>::~vector(&this->test_indices_);
  std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::~vector
            (&this->test_info_list_);
  std::
  unique_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&this->type_param_);
  std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

TestSuite::~TestSuite() {
  // Deletes every Test in the collection.
  ForEach(test_info_list_, internal::Delete<TestInfo>);
}